

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  uint uVar2;
  Tag *pTVar3;
  long *plVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  
  iVar1 = this->m_tags_size;
  uVar2 = this->m_tags_count;
  bVar6 = true;
  if (iVar1 <= (int)uVar2) {
    iVar7 = 1;
    if (iVar1 != 0) {
      iVar7 = iVar1 * 2;
    }
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar7) {
      uVar5 = (long)iVar7 << 4 | 8;
    }
    plVar4 = (long *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    uVar5 = 0;
    if (plVar4 == (long *)0x0) {
      bVar6 = false;
    }
    else {
      *plVar4 = (long)iVar7;
      pTVar3 = this->m_tags;
      uVar8 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar8 = uVar5;
      }
      for (; uVar8 * 0x10 != uVar5; uVar5 = uVar5 + 0x10) {
        *(undefined8 *)((long)plVar4 + uVar5 + 8) =
             *(undefined8 *)((long)&pTVar3->m_simple_tags + uVar5);
        *(undefined8 *)((long)plVar4 + uVar5 + 0x10) =
             *(undefined8 *)((long)&pTVar3->m_simple_tags_size + uVar5);
      }
      if (pTVar3 != (Tag *)0x0) {
        operator_delete__(&pTVar3[-1].m_simple_tags_size);
      }
      this->m_tags = (Tag *)(plVar4 + 1);
      this->m_tags_size = iVar7;
    }
  }
  return bVar6;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (m_tags_size > m_tags_count)
    return true;  // nothing else to do

  const int size = (m_tags_size == 0) ? 1 : 2 * m_tags_size;

  Tag* const tags = new (std::nothrow) Tag[size];

  if (tags == NULL)
    return false;

  for (int idx = 0; idx < m_tags_count; ++idx) {
    m_tags[idx].ShallowCopy(tags[idx]);
  }

  delete[] m_tags;
  m_tags = tags;

  m_tags_size = size;
  return true;
}